

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void c4::handle_error(srcloc where,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  char *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int ilen;
  va_list args;
  size_t msglen;
  char buf [1024];
  long local_500;
  undefined1 local_4f8 [24];
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  int local_43c;
  undefined4 local_438;
  undefined4 local_434;
  undefined1 *local_430;
  undefined1 *local_428;
  long local_420;
  char local_418 [1024];
  char *local_18;
  undefined8 local_10;
  uint local_8;
  
  if (in_AL != '\0') {
    local_4c8 = in_XMM0_Qa;
    local_4b8 = in_XMM1_Qa;
    local_4a8 = in_XMM2_Qa;
    local_498 = in_XMM3_Qa;
    local_488 = in_XMM4_Qa;
    local_478 = in_XMM5_Qa;
    local_468 = in_XMM6_Qa;
    local_458 = in_XMM7_Qa;
  }
  local_420 = 0;
  local_4e0 = in_RCX;
  local_4d8 = in_R8;
  local_4d0 = in_R9;
  local_18 = in_RDX;
  local_10 = in_RDI;
  local_8 = in_ESI;
  if ((s_error_flags & 6) != 0) {
    local_428 = local_4f8;
    local_430 = &stack0x00000008;
    local_434 = 0x30;
    local_438 = 0x18;
    local_43c = vsnprintf(local_418,0x400,in_RDX,&local_438);
    if ((local_43c < 0) || (0x3ff < local_43c)) {
      local_500 = 0x3ff;
    }
    else {
      local_500 = (long)local_43c;
    }
    local_420 = local_500;
  }
  if ((s_error_flags & 2) != 0) {
    fprintf(_stderr,"\n");
    fflush(_stderr);
    fprintf(_stderr,"%s:%d: ERROR: %s\n",local_10,(ulong)local_8,local_418);
    fflush(_stderr);
  }
  if (((s_error_flags & 4) != 0) && (s_error_callback != (code *)0x0)) {
    (*s_error_callback)(local_418,local_420);
  }
  if ((s_error_flags & 8) == 0) {
    if ((s_error_flags & 0x10) == 0) {
      return;
    }
    abort();
  }
  abort();
}

Assistant:

void handle_error(srcloc where, const char *fmt, ...)
{
    char buf[1024];
    size_t msglen = 0;
    if(s_error_flags & (ON_ERROR_LOG|ON_ERROR_CALLBACK))
    {
        va_list args;
        va_start(args, fmt);
        int ilen = vsnprintf(buf, sizeof(buf), fmt, args); // ss.vprintf(fmt, args);
        va_end(args);
        msglen = ilen >= 0 && ilen < (int)sizeof(buf) ? static_cast<size_t>(ilen) : sizeof(buf)-1;
    }

    if(s_error_flags & ON_ERROR_LOG)
    {
        C4_LOGF_ERR("\n");
#if defined(C4_ERROR_SHOWS_FILELINE) && defined(C4_ERROR_SHOWS_FUNC)
        C4_LOGF_ERR("%s:%d: ERROR: %s\n", where.file, where.line, buf);
        C4_LOGF_ERR("%s:%d: ERROR here: %s\n", where.file, where.line, where.func);
#elif defined(C4_ERROR_SHOWS_FILELINE)
        C4_LOGF_ERR("%s:%d: ERROR: %s\n", where.file, where.line, buf);
#elif ! defined(C4_ERROR_SHOWS_FUNC)
        C4_LOGF_ERR("ERROR: %s\n", buf);
#endif
    }

    if(s_error_flags & ON_ERROR_CALLBACK)
    {
        if(s_error_callback)
        {
            s_error_callback(buf, msglen/*ss.c_strp(), ss.tellp()*/);
        }
    }

    if(s_error_flags & ON_ERROR_ABORT)
    {
        abort();
    }

    if(s_error_flags & ON_ERROR_THROW)
    {
#if defined(C4_EXCEPTIONS_ENABLED) && defined(C4_ERROR_THROWS_EXCEPTION)
        throw Exception(buf);
#else
        abort();
#endif
    }
}